

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O1

void create_file(char *name)

{
  int iVar1;
  int iVar2;
  int extraout_EDX;
  char *__s1;
  uv_fs_event_t *puVar3;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  uv_fs_t req;
  undefined1 auStack_1f0 [32];
  uv_fs_t local_1d0;
  
  iVar2 = 0x41;
  auStack_1f0._0_8_ = (void *)0x1846ad;
  iVar1 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)(auStack_1f0 + 0x20),name,0x41,0x180,(uv_fs_cb)0x0)
  ;
  auStack_1f0._24_8_ = SEXT48(iVar1);
  auStack_1f0._16_8_ = 0;
  if ((uv_close_cb)auStack_1f0._24_8_ == (uv_close_cb)0x0) {
    auStack_1f0._0_8_ = (void *)0x1846d9;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_1f0 + 0x20));
    iVar2 = 0;
    auStack_1f0._0_8_ = (void *)0x1846e7;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)(auStack_1f0 + 0x20),
                        (uv_os_fd_t)local_1d0.result,(uv_fs_cb)0x0);
    auStack_1f0._24_8_ = SEXT48(iVar1);
    auStack_1f0._16_8_ = 0;
    if ((uv_close_cb)auStack_1f0._24_8_ == (uv_close_cb)0x0) {
      auStack_1f0._0_8_ = (void *)0x18470d;
      uv_fs_req_cleanup((uv_fs_t *)(auStack_1f0 + 0x20));
      return;
    }
  }
  else {
    auStack_1f0._0_8_ = (void *)0x184726;
    create_file_cold_1();
  }
  puVar3 = (uv_fs_event_t *)(auStack_1f0 + 0x18);
  __s1 = auStack_1f0 + 0x10;
  auStack_1f0._0_8_ = fs_event_cb_file;
  create_file_cold_2();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar3 == &fs_event) {
    auStack_1f0._0_8_ = SEXT48(iVar2);
    if ((code *)auStack_1f0._0_8_ != (code *)0x0) goto LAB_00184803;
    auStack_1f0._0_8_ = SEXT48(extraout_EDX);
    if ((code *)auStack_1f0._0_8_ != (code *)0x2) goto LAB_00184812;
    iVar1 = strcmp(__s1,"file2");
    auStack_1f0._0_8_ = SEXT48(iVar1);
    if ((code *)auStack_1f0._0_8_ == (code *)0x0) {
      iVar1 = uv_fs_event_stop(&fs_event);
      auStack_1f0._0_8_ = SEXT48(iVar1);
      if ((code *)auStack_1f0._0_8_ == (code *)0x0) {
        uv_close((uv_handle_t *)&fs_event,close_cb);
        return;
      }
      goto LAB_00184830;
    }
  }
  else {
    fs_event_cb_file_cold_1();
LAB_00184803:
    fs_event_cb_file_cold_2();
LAB_00184812:
    fs_event_cb_file_cold_3();
  }
  fs_event_cb_file_cold_4();
LAB_00184830:
  handle = (uv_handle_t *)auStack_1f0;
  fs_event_cb_file_cold_5();
  if (timer_cb_called != 0) {
    timer_cb_called = timer_cb_called + 1;
    touch_file("watch_dir/file2");
    uv_close(handle,close_cb);
    return;
  }
  timer_cb_called = timer_cb_called + 1;
  touch_file("watch_dir/file1");
  return;
}

Assistant:

static void create_file(const char* name) {
  int r;
  uv_os_fd_t file;
  uv_fs_t req;

  r = uv_fs_open(NULL, &req, name, UV_FS_O_WRONLY | UV_FS_O_CREAT,
                 S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT_OK(r);
  file = (uv_os_fd_t) req.result;
  uv_fs_req_cleanup(&req);
  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&req);
}